

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O2

void __thiscall
lunasvg::SVGGeometryElement::updateMarkerPositions
          (SVGGeometryElement *this,SVGMarkerPositionList *positions,SVGLayoutState *state)

{
  bool bVar1;
  PathCommand PVar2;
  SVGMarkerElement *pSVar3;
  SVGMarkerElement *pSVar4;
  int iVar5;
  uint uVar6;
  float fVar7;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float angle;
  SVGMarkerElement *markerStart;
  array<lunasvg::Point,_3UL> points;
  SVGMarkerElement *markerMid;
  PathIterator it;
  SVGMarkerElement *markerEnd;
  float local_f8;
  float local_f4;
  Point local_f0;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  float fStack_d4;
  undefined8 uStack_d0;
  SVGMarkerElement *local_c0;
  array<lunasvg::Point,_3UL> local_b8;
  vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>> *local_98;
  SVGMarkerElement *local_90;
  float local_84;
  PathIterator local_80;
  SVGMarkerElement *local_70;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_98 = (vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>> *)
             positions;
  bVar1 = Path::isEmpty(&this->m_path);
  if (!bVar1) {
    local_b8._M_elems[1] = (Point)(state->m_marker_start)._M_dataplus._M_p;
    local_b8._M_elems[0] = (Point)(state->m_marker_start)._M_string_length;
    pSVar3 = SVGElement::getMarker((SVGElement *)this,(string_view *)&local_b8);
    local_b8._M_elems[1] = (Point)(state->m_marker_mid)._M_dataplus._M_p;
    local_b8._M_elems[0] = (Point)(state->m_marker_mid)._M_string_length;
    local_c0 = pSVar3;
    pSVar4 = SVGElement::getMarker((SVGElement *)this,(string_view *)&local_b8);
    local_b8._M_elems[1] = (Point)(state->m_marker_end)._M_dataplus._M_p;
    local_b8._M_elems[0] = (Point)(state->m_marker_end)._M_string_length;
    local_90 = pSVar4;
    local_70 = SVGElement::getMarker((SVGElement *)this,(string_view *)&local_b8);
    if (((local_70 != (SVGMarkerElement *)0x0) || (pSVar3 != (SVGMarkerElement *)0x0)) ||
       (pSVar4 != (SVGMarkerElement *)0x0)) {
      local_f0.x = 0.0;
      local_f0.y = 0.0;
      local_58 = 0.0;
      fStack_54 = 0.0;
      uStack_50 = 0;
      local_b8._M_elems[0].x = 0.0;
      local_b8._M_elems[0].y = 0.0;
      local_b8._M_elems[1].x = 0.0;
      local_b8._M_elems[1].y = 0.0;
      local_b8._M_elems[2].x = 0.0;
      local_b8._M_elems[2].y = 0.0;
      PathIterator::PathIterator(&local_80,&this->m_path);
      local_f4 = 0.0;
      iVar5 = 0;
      local_f8 = 0.0;
      local_d8 = 0.0;
      fStack_d4 = 0.0;
      uStack_d0._0_4_ = 0;
      uStack_d0._4_4_ = 0;
      while (local_80.m_index < local_80.m_size) {
        PVar2 = PathIterator::currentSegment(&local_80,&local_b8);
        switch(PVar2) {
        case MoveTo:
          local_f4 = local_f0.x;
          local_f8 = local_f0.y;
          local_f0.x = local_b8._M_elems[0].x;
          local_f0.y = local_b8._M_elems[0].y;
          local_58 = local_b8._M_elems[0].x;
          fStack_54 = local_b8._M_elems[0].y;
          uStack_50 = 0;
          local_d8 = local_b8._M_elems[0].x;
          fStack_d4 = local_b8._M_elems[0].y;
          uStack_d0 = 0;
          break;
        case LineTo:
          local_f4 = local_f0.x;
          local_f8 = local_f0.y;
          local_d8 = local_b8._M_elems[0].x;
          fStack_d4 = local_b8._M_elems[0].y;
          goto LAB_0011330a;
        case CubicTo:
          local_f4 = local_b8._M_elems[1].x;
          local_f8 = local_b8._M_elems[1].y;
          local_d8 = local_b8._M_elems[2].x;
          fStack_d4 = local_b8._M_elems[2].y;
LAB_0011330a:
          uStack_d0 = 0;
          local_f0.x = local_d8;
          local_f0.y = fStack_d4;
          break;
        case Close:
          local_f4 = local_f0.x;
          local_f8 = local_f0.y;
          local_d8 = local_b8._M_elems[0].x;
          fStack_d4 = local_b8._M_elems[0].y;
          uStack_d0 = 0;
          local_f0.x = local_58;
          local_f0.y = fStack_54;
          local_58 = 0.0;
          fStack_54 = 0.0;
          uStack_50 = 0;
        }
        PathIterator::next(&local_80);
        fVar7 = fStack_d4;
        if ((local_80.m_index < local_80.m_size) &&
           (local_90 != (SVGMarkerElement *)0x0 || local_c0 != (SVGMarkerElement *)0x0)) {
          local_48 = fStack_d4;
          fStack_44 = fStack_d4;
          fStack_40 = fStack_d4;
          fStack_3c = fStack_d4;
          PathIterator::currentSegment(&local_80,&local_b8);
          fVar8 = local_b8._M_elems[0].x;
          fVar11 = local_f0.y;
          fVar12 = local_f0.x;
          fVar9 = local_b8._M_elems[0].y;
          if ((iVar5 == 0) && (local_c0 != (SVGMarkerElement *)0x0)) {
            local_dc = local_b8._M_elems[0].x;
            local_84 = local_f0.x;
            local_e0 = local_b8._M_elems[0].y;
            local_68 = local_f0.y;
            fVar7 = atan2f(local_b8._M_elems[0].y - local_f0.y,local_b8._M_elems[0].x - local_f0.x);
            local_e4 = (fVar7 * 180.0) / 3.1415927;
            if ((local_c0->m_orient).m_orientType == AutoStartReverse) {
              local_e4 = local_e4 + -180.0;
            }
            std::vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>::
            emplace_back<lunasvg::SVGMarkerElement*&,lunasvg::Point&,float&>
                      (local_98,&local_c0,&local_f0,&local_e4);
            fVar8 = local_dc;
            fVar11 = local_68;
            fVar12 = local_84;
            fVar9 = local_e0;
          }
          fVar7 = local_48;
          if ((iVar5 != 0) && (local_90 != (SVGMarkerElement *)0x0)) {
            local_dc = fVar8 - fVar12;
            local_e0 = fVar9 - fVar11;
            local_68 = atan2f(local_48 - local_f8,local_d8 - local_f4);
            fStack_64 = extraout_XMM0_Db;
            fVar7 = atan2f(local_e0,local_dc);
            auVar10._0_4_ = local_68 * 180.0;
            auVar10._4_4_ = fVar7 * 180.0;
            auVar10._8_4_ = fStack_64 * 0.0;
            auVar10._12_4_ = extraout_XMM0_Db_00 * 0.0;
            auVar10 = divps(auVar10,_DAT_0013a900);
            fVar7 = auVar10._0_4_;
            uVar6 = -(uint)(180.0 < ABS(fVar7 - auVar10._4_4_));
            local_e4 = ((float)(~uVar6 & (uint)fVar7 | (uint)(fVar7 + 360.0) & uVar6) +
                       auVar10._4_4_) * 0.5;
            std::vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>::
            emplace_back<lunasvg::SVGMarkerElement*&,lunasvg::Point&,float&>
                      (local_98,&local_90,&local_f0,&local_e4);
            fVar7 = local_48;
          }
        }
        if ((local_70 != (SVGMarkerElement *)0x0) && (local_80.m_size <= local_80.m_index)) {
          fVar7 = atan2f(fVar7 - local_f8,local_d8 - local_f4);
          local_e4 = (fVar7 * 180.0) / 3.1415927;
          std::vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>::
          emplace_back<lunasvg::SVGMarkerElement*&,lunasvg::Point&,float&>
                    (local_98,&local_70,&local_f0,&local_e4);
        }
        iVar5 = iVar5 + -1;
      }
    }
  }
  return;
}

Assistant:

void SVGGeometryElement::updateMarkerPositions(SVGMarkerPositionList& positions, const SVGLayoutState& state)
{
    if(m_path.isEmpty())
        return;
    auto markerStart = getMarker(state.marker_start());
    auto markerMid = getMarker(state.marker_mid());
    auto markerEnd = getMarker(state.marker_end());
    if(markerStart == nullptr && markerMid == nullptr && markerEnd == nullptr) {
        return;
    }

    Point origin;
    Point startPoint;
    Point inslopePoints[2];
    Point outslopePoints[2];

    int index = 0;
    std::array<Point, 3> points;
    PathIterator it(m_path);
    while(!it.isDone()) {
        switch(it.currentSegment(points)) {
        case PathCommand::MoveTo:
            startPoint = points[0];
            inslopePoints[0] = origin;
            inslopePoints[1] = points[0];
            origin = points[0];
            break;
        case PathCommand::LineTo:
            inslopePoints[0] = origin;
            inslopePoints[1] = points[0];
            origin = points[0];
            break;
        case PathCommand::CubicTo:
            inslopePoints[0] = points[1];
            inslopePoints[1] = points[2];
            origin = points[2];
            break;
        case PathCommand::Close:
            inslopePoints[0] = origin;
            inslopePoints[1] = points[0];
            origin = startPoint;
            startPoint = Point();
            break;
        }

        it.next();

        if(!it.isDone() && (markerStart || markerMid)) {
            it.currentSegment(points);
            outslopePoints[0] = origin;
            outslopePoints[1] = points[0];
            if(index == 0 && markerStart) {
                auto slope = outslopePoints[1] - outslopePoints[0];
                auto angle = 180.f * std::atan2(slope.y, slope.x) / PLUTOVG_PI;
                const auto& orient = markerStart->orient();
                if(orient.orientType() == SVGAngle::OrientType::AutoStartReverse)
                    angle -= 180.f;
                positions.emplace_back(markerStart, origin, angle);
            }

            if(index > 0 && markerMid) {
                auto inslope = inslopePoints[1] - inslopePoints[0];
                auto outslope = outslopePoints[1] - outslopePoints[0];
                auto inangle = 180.f * std::atan2(inslope.y, inslope.x) / PLUTOVG_PI;
                auto outangle = 180.f * std::atan2(outslope.y, outslope.x) / PLUTOVG_PI;
                if(std::abs(inangle - outangle) > 180.f)
                    inangle += 360.f;
                auto angle = (inangle + outangle) * 0.5f;
                positions.emplace_back(markerMid, origin, angle);
            }
        }

        if(markerEnd && it.isDone()) {
            auto slope = inslopePoints[1] - inslopePoints[0];
            auto angle = 180.f * std::atan2(slope.y, slope.x) / PLUTOVG_PI;
            positions.emplace_back(markerEnd, origin, angle);
        }

        index += 1;
    }
}